

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signet.cpp
# Opt level: O1

bool CheckSignetBlockSolution(CBlock *block,Params *consensusParams)

{
  CTransaction *txTo;
  long lVar1;
  bool bVar2;
  bool bVar3;
  Logger *pLVar4;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  initializer_list<CTxOut> __l;
  allocator_type local_2c9;
  vector<CTxOut,_std::allocator<CTxOut>_> local_2c8;
  TransactionSignatureChecker sigcheck;
  PrecomputedTransactionData txdata;
  optional<SignetTxs> signet_txs;
  CScript challenge;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CBlockHeader::GetHash(&txdata.m_prevouts_single_hash,&block->super_CBlockHeader);
  auVar6[0] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0]);
  auVar6[1] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[1] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[1]);
  auVar6[2] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[2] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[2]);
  auVar6[3] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[3] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[3]);
  auVar6[4] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[4] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[4]);
  auVar6[5] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[5] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[5]);
  auVar6[6] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[6] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[6]);
  auVar6[7] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[7] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[7]);
  auVar6[8] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[8] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[8]);
  auVar6[9] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[9] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[9]);
  auVar6[10] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[10] ==
                txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[10]);
  auVar6[0xb] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0xb] ==
                 txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar6[0xc] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0xc] ==
                 txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar6[0xd] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0xd] ==
                 txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar6[0xe] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0xe] ==
                 txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar6[0xf] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0xf] ==
                 txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar5[0] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x10] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar5[1] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x11] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar5[2] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x12] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar5[3] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x13] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar5[4] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x14] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar5[5] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x15] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar5[6] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x16] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar5[7] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x17] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar5[8] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x18] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar5[9] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x19] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar5[10] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x1a] ==
                txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar5[0xb] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x1b] ==
                 txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar5[0xc] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x1c] ==
                 txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar5[0xd] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x1d] ==
                 txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar5[0xe] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x1e] ==
                 txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar5[0xf] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x1f] ==
                 txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar5 = auVar5 & auVar6;
  if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff) {
    bVar2 = true;
  }
  else {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::
    prevector<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              (&challenge.super_CScriptBase,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(consensusParams->signet_challenge).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(consensusParams->signet_challenge).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    SignetTxs::Create(&signet_txs,block,(CScript *)&challenge.super_CScriptBase);
    if (signet_txs.super__Optional_base<SignetTxs,_false,_false>._M_payload.
        super__Optional_payload<SignetTxs,_true,_false,_false>.
        super__Optional_payload_base<SignetTxs>._M_engaged == false) {
      pLVar4 = LogInstance();
      bVar2 = BCLog::Logger::WillLogCategoryLevel(pLVar4,VALIDATION,Debug);
      if (bVar2) {
        logging_function_00._M_str = "CheckSignetBlockSolution";
        logging_function_00._M_len = 0x18;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/signet.cpp"
        ;
        source_file_00._M_len = 0x5a;
        LogPrintFormatInternal<>
                  (logging_function_00,source_file_00,0x88,VALIDATION,Debug,
                   (ConstevalFormatString<0U>)0x81def7);
      }
      bVar2 = false;
    }
    else {
      memset(&txdata,0,0x102);
      txdata.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._0_9_ = SUB169((undefined1  [16])0x0,0);
      txdata.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_finish._1_7_ = 0;
      txdata._280_9_ = SUB169((undefined1  [16])0x0,7);
      sigcheck.super_BaseSignatureChecker._vptr_BaseSignatureChecker =
           (_func_int **)
           (signet_txs.super__Optional_base<SignetTxs,_false,_false>._M_payload.
            super__Optional_payload<SignetTxs,_true,_false,_false>.
            super__Optional_payload_base<SignetTxs>._M_payload._M_value.m_to_spend.vout.
            super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
           _M_start)->nValue;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&sigcheck.txTo,
                 &((signet_txs.super__Optional_base<SignetTxs,_false,_false>._M_payload.
                    super__Optional_payload<SignetTxs,_true,_false,_false>.
                    super__Optional_payload_base<SignetTxs>._M_payload._M_value.m_to_spend.vout.
                    super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase);
      __l._M_len = 1;
      __l._M_array = (iterator)&sigcheck;
      std::vector<CTxOut,_std::allocator<CTxOut>_>::vector(&local_2c8,__l,&local_2c9);
      txTo = &signet_txs.super__Optional_base<SignetTxs,_false,_false>._M_payload.
              super__Optional_payload<SignetTxs,_true,_false,_false>.
              super__Optional_payload_base<SignetTxs>._M_payload._M_value.m_to_sign;
      PrecomputedTransactionData::Init<CTransaction>(&txdata,txTo,&local_2c8,false);
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_2c8);
      if (0x1c < sigcheck.txdata._4_4_) {
        free(sigcheck.txTo);
      }
      sigcheck.super_BaseSignatureChecker._vptr_BaseSignatureChecker =
           (_func_int **)&PTR_CheckECDSASignature_00b141d8;
      sigcheck.m_mdb = ASSERT_FAIL;
      sigcheck.nIn = 0;
      sigcheck.amount =
           (signet_txs.super__Optional_base<SignetTxs,_false,_false>._M_payload.
            super__Optional_payload<SignetTxs,_true,_false,_false>.
            super__Optional_payload_base<SignetTxs>._M_payload._M_value.m_to_spend.vout.
            super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
           _M_start)->nValue;
      sigcheck.txTo = txTo;
      sigcheck.txdata = &txdata;
      bVar2 = VerifyScript(&(signet_txs.super__Optional_base<SignetTxs,_false,_false>._M_payload.
                             super__Optional_payload<SignetTxs,_true,_false,_false>.
                             super__Optional_payload_base<SignetTxs>._M_payload._M_value.m_to_sign.
                             vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                             super__Vector_impl_data._M_start)->scriptSig,
                           &(signet_txs.super__Optional_base<SignetTxs,_false,_false>._M_payload.
                             super__Optional_payload<SignetTxs,_true,_false,_false>.
                             super__Optional_payload_base<SignetTxs>._M_payload._M_value.m_to_spend.
                             vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                             super__Vector_impl_data._M_start)->scriptPubKey,
                           &(signet_txs.super__Optional_base<SignetTxs,_false,_false>._M_payload.
                             super__Optional_payload<SignetTxs,_true,_false,_false>.
                             super__Optional_payload_base<SignetTxs>._M_payload._M_value.m_to_sign.
                             vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                             super__Vector_impl_data._M_start)->scriptWitness,0x815,
                           &sigcheck.super_BaseSignatureChecker,(ScriptError *)0x0);
      if (!bVar2) {
        pLVar4 = LogInstance();
        bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar4,VALIDATION,Debug);
        if (bVar3) {
          logging_function._M_str = "CheckSignetBlockSolution";
          logging_function._M_len = 0x18;
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/signet.cpp"
          ;
          source_file._M_len = 0x5a;
          LogPrintFormatInternal<>
                    (logging_function,source_file,0x94,VALIDATION,Debug,
                     (ConstevalFormatString<0U>)0x81df41);
        }
      }
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txdata.m_spent_outputs);
    }
    if (signet_txs.super__Optional_base<SignetTxs,_false,_false>._M_payload.
        super__Optional_payload<SignetTxs,_true,_false,_false>.
        super__Optional_payload_base<SignetTxs>._M_engaged == true) {
      std::_Optional_payload_base<SignetTxs>::_M_destroy
                ((_Optional_payload_base<SignetTxs> *)&signet_txs);
    }
    if (0x1c < challenge.super_CScriptBase._size) {
      free(challenge.super_CScriptBase._union.indirect_contents.indirect);
      challenge.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckSignetBlockSolution(const CBlock& block, const Consensus::Params& consensusParams)
{
    if (block.GetHash() == consensusParams.hashGenesisBlock) {
        // genesis block solution is always valid
        return true;
    }

    const CScript challenge(consensusParams.signet_challenge.begin(), consensusParams.signet_challenge.end());
    const std::optional<SignetTxs> signet_txs = SignetTxs::Create(block, challenge);

    if (!signet_txs) {
        LogDebug(BCLog::VALIDATION, "CheckSignetBlockSolution: Errors in block (block solution parse failure)\n");
        return false;
    }

    const CScript& scriptSig = signet_txs->m_to_sign.vin[0].scriptSig;
    const CScriptWitness& witness = signet_txs->m_to_sign.vin[0].scriptWitness;

    PrecomputedTransactionData txdata;
    txdata.Init(signet_txs->m_to_sign, {signet_txs->m_to_spend.vout[0]});
    TransactionSignatureChecker sigcheck(&signet_txs->m_to_sign, /* nInIn= */ 0, /* amountIn= */ signet_txs->m_to_spend.vout[0].nValue, txdata, MissingDataBehavior::ASSERT_FAIL);

    if (!VerifyScript(scriptSig, signet_txs->m_to_spend.vout[0].scriptPubKey, &witness, BLOCK_SCRIPT_VERIFY_FLAGS, sigcheck)) {
        LogDebug(BCLog::VALIDATION, "CheckSignetBlockSolution: Errors in block (block solution invalid)\n");
        return false;
    }
    return true;
}